

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathNewNodeSetList(xmlNodeSetPtr val)

{
  xmlXPathObjectPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  
  if (val != (xmlNodeSetPtr)0x0) {
    if (val->nodeTab == (xmlNodePtr *)0x0) {
      pxVar1 = xmlXPathNewNodeSet((xmlNodePtr)0x0);
      return pxVar1;
    }
    pxVar1 = xmlXPathNewNodeSet(*val->nodeTab);
    if (pxVar1 != (xmlXPathObjectPtr)0x0) {
      pxVar2 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val);
      pxVar1->nodesetval = pxVar2;
      if (pxVar2 != (xmlNodeSetPtr)0x0) {
        return pxVar1;
      }
      (*xmlFree)(pxVar1);
    }
  }
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewNodeSetList(xmlNodeSetPtr val)
{
    xmlXPathObjectPtr ret;

    if (val == NULL)
        ret = NULL;
    else if (val->nodeTab == NULL)
        ret = xmlXPathNewNodeSet(NULL);
    else {
        ret = xmlXPathNewNodeSet(val->nodeTab[0]);
        if (ret) {
            ret->nodesetval = xmlXPathNodeSetMerge(NULL, val);
            if (ret->nodesetval == NULL) {
                xmlFree(ret);
                return(NULL);
            }
        }
    }

    return (ret);
}